

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

ObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::GetObservationHistoryTree
          (PlanningUnitMADPDiscrete *this,Index agentI,Index ohI)

{
  pointer pvVar1;
  long lVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  ulong uVar5;
  ObservationHistoryTree *pOVar6;
  E *this_00;
  ulong uVar7;
  pointer_____offset_0x10___ *ppuVar8;
  ulong uVar9;
  ulong uVar10;
  
  if ((this->_m_params)._m_individualObservationHistories == false) {
    this_00 = (E *)__cxa_allocate_exception(0x28);
    ENotCached::ENotCached
              ((ENotCached *)this_00,
               "PlanningUnitMADPDiscrete::GetObservationHistoryTree IndividualObservationHistories are not cached!"
              );
    ppuVar8 = &ENotCached::typeinfo;
  }
  else {
    uVar9 = (ulong)agentI;
    iVar3 = (*(this->super_PlanningUnit)._vptr_PlanningUnit[6])();
    if (((long)(this->_m_observationHistoryTreeVectors).
               super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->_m_observationHistoryTreeVectors).
               super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
        CONCAT44(extraout_var,iVar3) == 0) {
      if (CONCAT44(extraout_var,iVar3) <= uVar9) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index ohI) index agentI out of bounds"
                   ,0x6b);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
        return (ObservationHistoryTree *)0x0;
      }
      sVar4 = GetNrObservationHistories(this,agentI);
      pvVar1 = (this->_m_observationHistoryTreeVectors).
               super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = *(long *)&pvVar1[uVar9].
                        super__Vector_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                        ._M_impl.super__Vector_impl_data;
      uVar7 = (long)pvVar1[uVar9].
                    super__Vector_base<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - lVar2 >> 3;
      if (uVar7 == sVar4) {
        uVar10 = (ulong)ohI;
        if (uVar10 < sVar4) {
          uVar5 = ((long)(this->_m_observationHistoryTreeVectors).
                         super__Vector_base<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>,_std::allocator<std::vector<ObservationHistoryTree_*,_std::allocator<ObservationHistoryTree_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
                  -0x5555555555555555;
          if ((uVar5 < uVar9 || uVar5 - uVar9 == 0) ||
             (uVar5 = uVar7, uVar9 = uVar10, uVar7 <= uVar10)) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9,uVar5);
          }
          pOVar6 = *(ObservationHistoryTree **)(lVar2 + uVar10 * 8);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index a) index ohI out of bounds"
                     ,0x66);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
          std::ostream::put('X');
          pOVar6 = (ObservationHistoryTree *)std::ostream::flush();
        }
        if (sVar4 <= uVar10) {
          return (ObservationHistoryTree *)0x0;
        }
        return pOVar6;
      }
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"_m_observationHistoryTreeVectors[agentI].size() != nrOH)");
    }
    else {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"_m_observationHistoryTreeVectors.size() != nrA)");
    }
    ppuVar8 = &E::typeinfo;
  }
  __cxa_throw(this_00,ppuVar8,E::~E);
}

Assistant:

ObservationHistoryTree* PlanningUnitMADPDiscrete::GetObservationHistoryTree(Index agentI, Index ohI) const
{
    if(!_m_params.GetComputeIndividualObservationHistories())
        throw ENotCached("PlanningUnitMADPDiscrete::GetObservationHistoryTree IndividualObservationHistories are not cached!");

    size_t nrA = GetNrAgents();
    if(_m_observationHistoryTreeVectors.size() != nrA)
        throw E("_m_observationHistoryTreeVectors.size() != nrA)");

    if(agentI < nrA )
    {
    size_t nrOH = GetNrObservationHistories(agentI);
if(DEBUG_PUD){cout << "_m_observationHistoryTreeVectors["<<agentI<<"].size() = " <<_m_observationHistoryTreeVectors[agentI].size()<<endl;}
    if(_m_observationHistoryTreeVectors[agentI].size() != nrOH)
        throw E("_m_observationHistoryTreeVectors[agentI].size() != nrOH)");

    if(ohI < nrOH )
    {
if(DEBUG_PUD){ cout <<"accessing _m_observationHistoryTreeVectors["<<    agentI<<"]["<<ohI<<"]"<<endl;}

        ObservationHistoryTree* oht = 
            _m_observationHistoryTreeVectors.at(agentI).at(ohI);
if(DEBUG_PUD){ cout <<"...done - returning "<<oht<<endl;}
        return (oht);
    }
    else
        cerr << "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index a) index ohI out of bounds"<<endl;
    }
    else
    cerr << "WARNING PlanningUnitMADPDiscrete::GetObservationHistory(Index agentI, Index ohI) index agentI out of bounds"<<endl;   
    
    return(0);
   
}